

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::shr<unsigned_int>
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,uint n)

{
  uint uVar1;
  value_type_conflict vVar2;
  sbyte sVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = 8;
  if (n >> 5 < 8) {
    uVar4 = n >> 5;
  }
  if (0x1f < n) {
    for (lVar5 = 0; 0x20 - (ulong)(uVar4 * 4) != lVar5; lVar5 = lVar5 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5) =
           *(undefined4 *)
            ((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5 + (ulong)(uVar4 * 4))
      ;
    }
    vVar2 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
    for (lVar5 = -(ulong)(uVar4 * 4); lVar5 != 0; lVar5 = lVar5 + 4) {
      *(int *)((long)this[1].values.super_array<unsigned_int,_8UL>.elems + lVar5) =
           (int)vVar2 >> 0x1f;
    }
  }
  if ((n & 0x1f) != 0) {
    sVar3 = (sbyte)(n & 0x1f);
    lVar5 = -(ulong)(uVar4 << 2);
    uVar4 = ((uint)((int)(this->values).super_array<unsigned_int,_8UL>.elems[7] >> 0x1f) >>
            (-sVar3 & 0x1fU)) << (-sVar3 & 0x1fU);
    for (; lVar5 != -0x20; lVar5 = lVar5 + -4) {
      uVar1 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5 + 0x1c);
      *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5 + 0x1c) =
           uVar1 >> sVar3 | uVar4;
      uVar4 = uVar1 << (0x20U - sVar3 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }